

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Value * json_parse_file(char *filename)

{
  char *pcVar1;
  JSON_Value *pJVar2;
  
  pcVar1 = read_file(filename);
  if (pcVar1 == (char *)0x0) {
    pJVar2 = (JSON_Value *)0x0;
  }
  else {
    pJVar2 = json_parse_string((char *)0x173c79);
    (*parson_free)(pcVar1);
  }
  return pJVar2;
}

Assistant:

JSON_Value * json_parse_file(const char *filename) {
    char *file_contents = read_file(filename);
    JSON_Value *output_value = NULL;
    if (file_contents == NULL) {
        return NULL;
    }
    output_value = json_parse_string(file_contents);
    parson_free(file_contents);
    return output_value;
}